

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ApplyStrainComputeElasticStress
          (TPZDecomposed *this,TPZTensor<TFad<6,_double>_> *Stress,REAL *K,REAL *G)

{
  TFad<6,_double> *pTVar1;
  TFad<6,_double> *pTVar2;
  TPZTensor<TFad<6,_double>_> *this_00;
  TPZTensor<TFad<6,_double>_> *source;
  TFad<6,_double> *this_01;
  TFad<6,_double> *in_RDI;
  TPZTensor<TFad<6,_double>_> SigVol;
  TFad<6,_double> trace_3;
  TFad<6,_double> trace;
  TFad<6,_double> sig3;
  TFad<6,_double> sig2;
  TFad<6,_double> sig1;
  TFad<6,_double> *in_stack_fffffffffffffbc8;
  TFad<6,_double> *in_stack_fffffffffffffbd0;
  TFad<6,_double> *in_stack_fffffffffffffbd8;
  TFad<6,_double> *in_stack_fffffffffffffbe0;
  TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFadCst<double>_>_> *in_stack_fffffffffffffbf8;
  TFad<6,_double> *in_stack_fffffffffffffc00;
  TPZTensor<TFad<6,_double>_> *in_stack_fffffffffffffc30;
  
  pTVar2 = (TFad<6,_double> *)(in_RDI->dx_ + 5);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)pTVar2,0);
  TFad<6,_double>::TFad(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)pTVar2,1);
  TFad<6,_double>::TFad(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  pTVar1 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI->dx_ + 5),2);
  TFad<6,_double>::TFad(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  ::operator+(pTVar1,in_stack_fffffffffffffc00);
  ::operator+((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)pTVar1,
              in_stack_fffffffffffffc00);
  TFad<6,double>::
  TFad<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>
            (in_stack_fffffffffffffc00,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
              *)in_stack_fffffffffffffbf8);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b3df0);
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b3dfd);
  ::operator/(pTVar2,(double *)in_RDI);
  TFad<6,double>::TFad<TFadBinaryDiv<TFad<6,double>,TFadCst<double>>>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFadCst<double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFadCst<double>_>_> *)0x14b3e52);
  TPZTensor<TFad<6,_double>_>::TPZTensor(in_stack_fffffffffffffc30);
  ::operator*((double *)pTVar2,in_RDI);
  pTVar2 = ZZ((TPZTensor<TFad<6,_double>_> *)0x14b3e8d);
  TFad<6,double>::operator=
            (in_stack_fffffffffffffbe0,
             (TFadExpr<TFadBinaryMul<TFadCst<double>,_TFad<6,_double>_>_> *)
             in_stack_fffffffffffffbd8);
  YY((TPZTensor<TFad<6,_double>_> *)0x14b3eba);
  TFad<6,_double>::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  this_00 = (TPZTensor<TFad<6,_double>_> *)XX((TPZTensor<TFad<6,_double>_> *)0x14b3ee4);
  TFad<6,_double>::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFadCst<double>,_TFad<6,_double>_>_> *)0x14b3f09);
  ::operator-(pTVar1,pTVar2);
  source = (TPZTensor<TFad<6,_double>_> *)XX((TPZTensor<TFad<6,_double>_> *)0x14b3f35);
  TFad<6,double>::operator=
            ((TFad<6,_double> *)this_00,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)source);
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b3f5d);
  ::operator-(pTVar1,pTVar2);
  this_01 = YY((TPZTensor<TFad<6,_double>_> *)0x14b3f89);
  TFad<6,double>::operator=
            ((TFad<6,_double> *)this_00,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)source);
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b3fb1);
  ::operator-(pTVar1,pTVar2);
  pTVar1 = ZZ((TPZTensor<TFad<6,_double>_> *)0x14b3fdd);
  TFad<6,double>::operator=
            ((TFad<6,_double> *)this_00,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)source);
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b4003);
  TFad<6,_double>::TFad(this_01,(double *)pTVar1);
  TPZTensor<TFad<6,_double>_>::operator*=(this_00,(TFad<6,_double> *)source);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b4048);
  TPZTensor<TFad<6,_double>_>::operator+=(this_00,source);
  ~TPZTensor((TPZTensor<TFad<6,_double>_> *)0x14b406c);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b4079);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b4086);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b4093);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b40a0);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b40ad);
  return;
}

Assistant:

void ApplyStrainComputeElasticStress(TPZTensor<T> &Stress, REAL &K, REAL & G) {
            const T sig1 = this->fEigenvalues[0];
            const T sig2 = this->fEigenvalues[1];
            const T sig3 = this->fEigenvalues[2];
            const T trace = sig1 + sig2 + sig3;
            const T trace_3 = trace / 3.;

            TPZTensor<T> SigVol;
            SigVol.XX() = SigVol.YY() = SigVol.ZZ() = K * trace;

            Stress.XX() = sig1 - trace_3;
            Stress.YY() = sig2 - trace_3;
            Stress.ZZ() = sig3 - trace_3;
            Stress *= (2 * G);
            Stress += SigVol;
        }